

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglAndroidUtil.cpp
# Opt level: O0

MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_> *
deqp::egl::Image::createAndroidNativeImageSource
          (MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
           *__return_storage_ptr__,GLenum format)

{
  allocator<char> local_39;
  string local_38;
  GLenum local_14;
  MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
  *pMStack_10;
  GLenum format_local;
  
  local_14 = format;
  pMStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Not Android platform",&local_39);
  createUnsupportedImageSource(__return_storage_ptr__,&local_38,local_14);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<ImageSource> createAndroidNativeImageSource	(GLenum format)
{
	return createUnsupportedImageSource("Not Android platform", format);
}